

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O1

void __thiscall libtorrent::add_torrent_alert::~add_torrent_alert(add_torrent_alert *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  add_torrent_params::~add_torrent_params(&this->params);
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_004ebb90;
  p_Var2 = (this->super_torrent_alert).handle.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  operator_delete(this,0x390);
  return;
}

Assistant:

struct TORRENT_EXPORT add_torrent_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT add_torrent_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, add_torrent_params p, error_code const& ec);

		TORRENT_DEFINE_ALERT_PRIO(add_torrent_alert, 67, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;

		// This contains copies of the most important fields from the original
		// add_torrent_params object, passed to add_torrent() or
		// async_add_torrent(). Specifically, these fields are copied:
		//
		// * version
		// * ti
		// * name
		// * save_path
		// * userdata
		// * tracker_id
		// * flags
		// * info_hash
		//
		// the info_hash field will be updated with the info-hash of the torrent
		// specified by ``ti``.
		add_torrent_params params;

		// set to the error, if one occurred while adding the torrent.
		error_code error;
	}